

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_fold_pclmulqdq_tpl.h
# Opt level: O0

void crc32_fold_pclmulqdq_copy(crc32_fold *crc,uint8_t *dst,uint8_t *src,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong in_RCX;
  ulong *in_RDX;
  ulong *in_RSI;
  __m128i *in_RDI;
  ulong uVar6;
  __m128i *palVar7;
  __m128i *palVar8;
  ulong uVar9;
  ulong uVar10;
  __m128i chorba1;
  __m128i chorba2;
  __m128i chorba3;
  __m128i chorba4;
  __m128i chorba5;
  __m128i chorba6;
  __m128i chorba7;
  __m128i chorba8;
  char partial_buf [16];
  __m128i xmm_crc_part;
  __m128i xmm_crc3;
  __m128i xmm_crc2;
  __m128i xmm_crc1;
  __m128i xmm_crc0;
  __m128i xmm_t3;
  __m128i xmm_t2;
  __m128i xmm_t1;
  __m128i xmm_t0;
  unsigned_long algn_diff;
  __m128i *in_stack_ffffffffffffe350;
  __m128i *in_stack_ffffffffffffe358;
  __m128i *in_stack_ffffffffffffe360;
  __m128i *in_stack_ffffffffffffe368;
  __m128i *in_stack_ffffffffffffe398;
  __m128i *in_stack_ffffffffffffe3a0;
  __m128i *in_stack_ffffffffffffe3a8;
  __m128i *in_stack_ffffffffffffe3b0;
  __m128i *in_stack_ffffffffffffe3b8;
  ulong in_stack_ffffffffffffe3c0;
  __m128i *local_1c38;
  __m128i *in_stack_ffffffffffffe3d0;
  __m128i *xmm_crc2_00;
  __m128i *xmm_crc1_00;
  __m128i *in_stack_ffffffffffffe3e8;
  ulong uStack_1c10;
  ulong local_1c08;
  ulong uStack_1c00;
  ulong local_1bf8;
  ulong uStack_1bf0;
  ulong local_1be8;
  ulong uStack_1be0;
  ulong local_1bd8;
  ulong uStack_1bd0;
  ulong local_1bc8;
  ulong uStack_1bc0;
  ulong local_1bb8;
  ulong uStack_1bb0;
  ulong local_1ba8;
  ulong uStack_1ba0;
  ulong local_1b90;
  ulong local_1b88;
  ulong *local_1b80;
  ulong *local_1b78;
  __m128i *local_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  ulong *local_1b58;
  ulong *local_1b50;
  ulong *local_1b48;
  ulong *local_1b40;
  ulong *local_1b38;
  ulong *local_1b30;
  ulong *local_1b28;
  ulong *local_1b20;
  ulong *local_1b18;
  ulong *local_1b10;
  __m128i **local_1b08;
  ulong *local_1b00;
  ulong *local_1af8;
  ulong *local_1af0;
  ulong *local_1ae8;
  ulong *local_1ae0;
  ulong *local_1ad8;
  ulong *local_1ad0;
  ulong *local_1ac8;
  ulong *local_1ac0;
  ulong *local_1ab8;
  ulong *local_1ab0;
  ulong *local_1aa8;
  ulong *local_1aa0;
  ulong *local_1a98;
  ulong *local_1a90;
  ulong *local_1a88;
  ulong *local_1a80;
  ulong *local_1a78;
  ulong *local_1a70;
  ulong *local_1a68;
  ulong *local_1a60;
  ulong *local_1a58;
  ulong *local_1a50;
  ulong *local_1a48;
  ulong *local_1a40;
  ulong *local_1a38;
  ulong *local_1a30;
  ulong *local_1a28;
  ulong *local_1a20;
  ulong *local_1a18;
  ulong *local_1a10;
  ulong *local_1a08;
  ulong *local_1a00;
  ulong *local_19f8;
  ulong *local_19f0;
  ulong *local_19e8;
  ulong *local_19e0;
  ulong *local_19d8;
  ulong *local_19d0;
  ulong *local_19c8;
  ulong *local_19c0;
  ulong local_19b8;
  ulong uStack_19b0;
  __m128i *local_19a8;
  ulong uStack_19a0;
  ulong local_1998;
  ulong uStack_1990;
  __m128i *local_1988;
  ulong uStack_1980;
  ulong local_1978;
  ulong uStack_1970;
  ulong local_1968;
  ulong uStack_1960;
  ulong local_1958;
  ulong uStack_1950;
  __m128i *local_1948;
  ulong uStack_1940;
  ulong local_1938;
  ulong uStack_1930;
  ulong local_1928;
  ulong uStack_1920;
  ulong local_1918;
  ulong uStack_1910;
  ulong local_1908;
  ulong uStack_1900;
  ulong local_18f8;
  ulong uStack_18f0;
  __m128i *local_18e8;
  ulong uStack_18e0;
  ulong local_18d8;
  ulong uStack_18d0;
  ulong local_18c8;
  ulong uStack_18c0;
  ulong local_18b8;
  ulong uStack_18b0;
  ulong local_18a8;
  ulong uStack_18a0;
  ulong local_1898;
  ulong uStack_1890;
  ulong local_1888;
  ulong uStack_1880;
  __m128i *local_1878;
  ulong uStack_1870;
  ulong local_1868;
  ulong uStack_1860;
  ulong local_1858;
  ulong uStack_1850;
  ulong local_1848;
  ulong uStack_1840;
  ulong local_1838;
  ulong uStack_1830;
  ulong local_1828;
  ulong uStack_1820;
  ulong local_1818;
  ulong uStack_1810;
  ulong local_1808;
  ulong uStack_1800;
  ulong local_17f8;
  __m128i *palStack_17f0;
  ulong local_17e8;
  ulong uStack_17e0;
  __m128i *local_17d8;
  __m128i *palStack_17d0;
  ulong local_17c8;
  ulong uStack_17c0;
  ulong local_17b8;
  __m128i *palStack_17b0;
  ulong local_17a8;
  ulong uStack_17a0;
  __m128i *local_1798;
  ulong uStack_1790;
  ulong local_1788;
  ulong uStack_1780;
  __m128i *local_1778;
  __m128i *palStack_1770;
  ulong local_1768;
  ulong uStack_1760;
  ulong local_1758;
  __m128i *palStack_1750;
  ulong local_1748;
  ulong uStack_1740;
  ulong local_1738;
  ulong uStack_1730;
  ulong local_1728;
  ulong uStack_1720;
  __m128i *local_1718;
  ulong uStack_1710;
  ulong local_1708;
  ulong uStack_1700;
  __m128i *local_16f8;
  __m128i *palStack_16f0;
  ulong local_16e8;
  ulong uStack_16e0;
  __m128i *local_16d8;
  ulong uStack_16d0;
  ulong local_16c8;
  ulong uStack_16c0;
  ulong local_16b8;
  ulong uStack_16b0;
  ulong local_16a8;
  ulong uStack_16a0;
  ulong local_1698;
  ulong uStack_1690;
  ulong local_1688;
  ulong uStack_1680;
  ulong local_1678;
  ulong uStack_1670;
  ulong local_1668;
  ulong uStack_1660;
  ulong local_1658;
  ulong uStack_1650;
  ulong local_1648;
  ulong uStack_1640;
  ulong local_1638;
  ulong uStack_1630;
  ulong local_1628;
  ulong uStack_1620;
  __m128i *local_1618;
  ulong uStack_1610;
  ulong local_1608;
  ulong uStack_1600;
  ulong local_15f8;
  __m128i *palStack_15f0;
  ulong local_15e8;
  ulong uStack_15e0;
  ulong local_15d8;
  ulong uStack_15d0;
  ulong local_15c8;
  ulong uStack_15c0;
  __m128i *local_15b8;
  __m128i *palStack_15b0;
  ulong local_15a8;
  ulong uStack_15a0;
  ulong local_1598;
  ulong uStack_1590;
  ulong local_1588;
  ulong uStack_1580;
  __m128i *local_1578;
  __m128i *palStack_1570;
  ulong local_1568;
  ulong uStack_1560;
  ulong local_1558;
  __m128i *palStack_1550;
  ulong local_1548;
  ulong uStack_1540;
  ulong local_1538;
  ulong uStack_1530;
  ulong local_1528;
  ulong uStack_1520;
  __m128i *local_1518;
  __m128i *palStack_1510;
  ulong local_1508;
  ulong uStack_1500;
  __m128i *local_14f8;
  __m128i *palStack_14f0;
  ulong local_14e8;
  ulong uStack_14e0;
  __m128i *local_14d8;
  ulong uStack_14d0;
  ulong local_14c8;
  ulong uStack_14c0;
  __m128i *local_14b8;
  __m128i *palStack_14b0;
  ulong local_14a8;
  ulong uStack_14a0;
  __m128i *local_1498;
  __m128i *palStack_1490;
  ulong local_1488;
  ulong uStack_1480;
  __m128i *local_1478;
  __m128i *palStack_1470;
  ulong local_1468;
  ulong uStack_1460;
  __m128i *local_1458;
  ulong uStack_1450;
  ulong local_1448;
  ulong uStack_1440;
  ulong local_1438;
  ulong uStack_1430;
  ulong local_1428;
  ulong uStack_1420;
  __m128i *local_1418;
  ulong uStack_1410;
  ulong local_1408;
  ulong uStack_1400;
  ulong local_13f8;
  __m128i *palStack_13f0;
  ulong local_13e8;
  ulong uStack_13e0;
  __m128i *local_13d8;
  ulong uStack_13d0;
  ulong local_13c8;
  ulong uStack_13c0;
  ulong local_13b8;
  ulong uStack_13b0;
  ulong local_13a8;
  ulong uStack_13a0;
  ulong local_1398;
  ulong uStack_1390;
  ulong local_1388;
  ulong uStack_1380;
  ulong local_1378;
  ulong uStack_1370;
  ulong local_1368;
  ulong uStack_1360;
  ulong local_1358;
  ulong uStack_1350;
  ulong local_1348;
  ulong uStack_1340;
  __m128i *local_1338;
  __m128i *palStack_1330;
  ulong local_1328;
  ulong uStack_1320;
  __m128i *local_1318;
  ulong uStack_1310;
  ulong local_1308;
  ulong uStack_1300;
  ulong local_12f8;
  ulong uStack_12f0;
  ulong local_12e8;
  ulong uStack_12e0;
  __m128i *local_12d8;
  __m128i *palStack_12d0;
  ulong local_12c8;
  ulong uStack_12c0;
  ulong local_12b8;
  __m128i *palStack_12b0;
  ulong local_12a8;
  ulong uStack_12a0;
  ulong local_1298;
  ulong uStack_1290;
  ulong local_1288;
  ulong uStack_1280;
  __m128i *local_1278;
  __m128i *palStack_1270;
  ulong local_1268;
  ulong uStack_1260;
  __m128i *local_1258;
  ulong uStack_1250;
  ulong local_1248;
  ulong uStack_1240;
  __m128i *local_1238;
  ulong uStack_1230;
  ulong local_1228;
  ulong uStack_1220;
  __m128i *local_1218;
  __m128i *palStack_1210;
  ulong local_1208;
  ulong uStack_1200;
  __m128i *local_11f8;
  __m128i *palStack_11f0;
  ulong local_11e8;
  ulong uStack_11e0;
  __m128i *local_11d8;
  __m128i *palStack_11d0;
  ulong local_11c8;
  ulong uStack_11c0;
  ulong local_11b8;
  ulong uStack_11b0;
  ulong local_11a8;
  ulong uStack_11a0;
  __m128i *local_1198;
  ulong uStack_1190;
  ulong local_1188;
  ulong uStack_1180;
  ulong local_1178;
  __m128i *palStack_1170;
  ulong local_1168;
  ulong uStack_1160;
  ulong local_1158;
  ulong uStack_1150;
  ulong local_1148;
  ulong uStack_1140;
  __m128i *local_1138;
  __m128i *palStack_1130;
  ulong local_1128;
  ulong uStack_1120;
  __m128i *local_1118;
  ulong uStack_1110;
  ulong local_1108;
  ulong uStack_1100;
  ulong local_10f8;
  ulong uStack_10f0;
  ulong local_10e8;
  ulong uStack_10e0;
  __m128i *local_10d8;
  __m128i *palStack_10d0;
  ulong local_10c8;
  ulong uStack_10c0;
  ulong local_10b8;
  __m128i *palStack_10b0;
  ulong local_10a8;
  ulong uStack_10a0;
  __m128i *local_1098;
  ulong uStack_1090;
  ulong local_1088;
  ulong uStack_1080;
  ulong local_1078;
  ulong uStack_1070;
  ulong local_1068;
  ulong uStack_1060;
  ulong local_1058;
  ulong uStack_1050;
  ulong local_1048;
  ulong uStack_1040;
  ulong local_1038;
  ulong uStack_1030;
  ulong local_1028;
  ulong uStack_1020;
  ulong local_1018;
  ulong uStack_1010;
  ulong local_1008;
  ulong uStack_1000;
  __m128i *local_ff8;
  __m128i *palStack_ff0;
  ulong local_fe8;
  ulong uStack_fe0;
  __m128i *local_fd8;
  ulong uStack_fd0;
  ulong local_fc8;
  ulong uStack_fc0;
  __m128i *local_fb8;
  ulong uStack_fb0;
  ulong local_fa8;
  ulong uStack_fa0;
  __m128i *local_f98;
  __m128i *palStack_f90;
  ulong local_f88;
  ulong uStack_f80;
  ulong local_f78;
  __m128i *palStack_f70;
  ulong local_f68;
  ulong uStack_f60;
  __m128i *local_f58;
  __m128i *palStack_f50;
  ulong local_f48;
  ulong uStack_f40;
  __m128i *local_f38;
  __m128i *palStack_f30;
  ulong local_f28;
  ulong uStack_f20;
  ulong local_f18;
  ulong uStack_f10;
  ulong local_f08;
  ulong uStack_f00;
  __m128i *local_ef8;
  ulong uStack_ef0;
  ulong local_ee8;
  ulong uStack_ee0;
  __m128i *local_ed8;
  __m128i *palStack_ed0;
  ulong local_ec8;
  ulong uStack_ec0;
  ulong local_eb8;
  ulong uStack_eb0;
  ulong local_ea8;
  ulong uStack_ea0;
  __m128i *local_e98;
  __m128i *palStack_e90;
  ulong local_e88;
  ulong uStack_e80;
  __m128i *local_e78;
  ulong uStack_e70;
  ulong local_e68;
  ulong uStack_e60;
  ulong local_e58;
  ulong uStack_e50;
  ulong local_e48;
  ulong uStack_e40;
  __m128i *local_e38;
  ulong uStack_e30;
  ulong local_e28;
  ulong uStack_e20;
  ulong local_e18;
  ulong uStack_e10;
  ulong local_e08;
  ulong uStack_e00;
  __m128i *local_df8;
  __m128i *palStack_df0;
  ulong local_de8;
  ulong uStack_de0;
  __m128i *local_dd8;
  ulong uStack_dd0;
  ulong local_dc8;
  ulong uStack_dc0;
  ulong local_db8;
  ulong uStack_db0;
  ulong local_da8;
  ulong uStack_da0;
  __m128i *local_d98;
  ulong uStack_d90;
  ulong local_d88;
  ulong uStack_d80;
  ulong local_d78;
  ulong uStack_d70;
  ulong local_d68;
  ulong uStack_d60;
  ulong local_d58;
  ulong uStack_d50;
  ulong local_d48;
  ulong uStack_d40;
  ulong local_d38;
  ulong uStack_d30;
  ulong local_d28;
  ulong uStack_d20;
  ulong local_d18;
  ulong uStack_d10;
  ulong local_d08;
  ulong uStack_d00;
  __m128i *local_cf8;
  __m128i *palStack_cf0;
  ulong local_ce8;
  ulong uStack_ce0;
  __m128i *local_cd8;
  __m128i *palStack_cd0;
  ulong local_cc8;
  ulong uStack_cc0;
  ulong local_cb8;
  __m128i *palStack_cb0;
  ulong local_ca8;
  ulong uStack_ca0;
  __m128i *local_c98;
  __m128i *palStack_c90;
  ulong local_c88;
  ulong uStack_c80;
  __m128i *local_c78;
  __m128i *palStack_c70;
  ulong local_c68;
  ulong uStack_c60;
  __m128i *local_c58;
  ulong uStack_c50;
  ulong local_c48;
  ulong uStack_c40;
  __m128i *local_c38;
  __m128i *palStack_c30;
  ulong local_c28;
  ulong uStack_c20;
  __m128i *local_c18;
  __m128i *palStack_c10;
  ulong local_c08;
  ulong uStack_c00;
  __m128i *local_bf8;
  ulong uStack_bf0;
  ulong local_be8;
  ulong uStack_be0;
  __m128i *local_bd8;
  ulong uStack_bd0;
  ulong local_bc8;
  ulong uStack_bc0;
  __m128i *local_bb8;
  ulong uStack_bb0;
  ulong local_ba8;
  ulong uStack_ba0;
  ulong local_b98;
  ulong uStack_b90;
  ulong local_b88;
  ulong uStack_b80;
  __m128i *local_b78;
  ulong uStack_b70;
  ulong local_b68;
  ulong uStack_b60;
  ulong local_b58;
  ulong uStack_b50;
  ulong local_b48;
  ulong uStack_b40;
  ulong local_b38;
  ulong uStack_b30;
  ulong local_b28;
  ulong uStack_b20;
  ulong local_b18;
  ulong uStack_b10;
  ulong local_b08;
  ulong uStack_b00;
  ulong local_af8;
  ulong uStack_af0;
  ulong local_ae8;
  ulong uStack_ae0;
  __m128i *local_ad8;
  __m128i *palStack_ad0;
  ulong local_ac8;
  ulong uStack_ac0;
  __m128i *local_ab8;
  __m128i *palStack_ab0;
  ulong local_aa8;
  ulong uStack_aa0;
  ulong local_a98;
  __m128i *palStack_a90;
  ulong local_a88;
  ulong uStack_a80;
  __m128i *local_a78;
  ulong uStack_a70;
  ulong local_a68;
  ulong uStack_a60;
  __m128i *local_a58;
  __m128i *palStack_a50;
  ulong local_a48;
  ulong uStack_a40;
  ulong local_a38;
  __m128i *palStack_a30;
  ulong local_a28;
  ulong uStack_a20;
  __m128i *local_a18;
  ulong uStack_a10;
  ulong local_a08;
  ulong uStack_a00;
  ulong local_9f8;
  ulong uStack_9f0;
  ulong local_9e8;
  ulong uStack_9e0;
  ulong local_9d8;
  ulong uStack_9d0;
  ulong local_9c8;
  ulong uStack_9c0;
  ulong local_9b8;
  ulong uStack_9b0;
  ulong local_9a8;
  ulong uStack_9a0;
  __m128i *local_998;
  ulong uStack_990;
  ulong local_988;
  ulong uStack_980;
  __m128i *local_978;
  __m128i *palStack_970;
  ulong local_968;
  ulong uStack_960;
  ulong local_958;
  ulong uStack_950;
  ulong local_948;
  ulong uStack_940;
  __m128i *local_938;
  ulong uStack_930;
  ulong local_928;
  ulong uStack_920;
  ulong local_918;
  ulong uStack_910;
  ulong local_908;
  ulong uStack_900;
  ulong local_8f8;
  ulong uStack_8f0;
  ulong local_8e8;
  ulong uStack_8e0;
  ulong local_8d8;
  __m128i *palStack_8d0;
  ulong local_8c8;
  ulong uStack_8c0;
  ulong local_8b8;
  ulong uStack_8b0;
  ulong local_8a8;
  ulong uStack_8a0;
  __m128i *local_898;
  __m128i *palStack_890;
  ulong local_888;
  ulong uStack_880;
  __m128i *local_878;
  __m128i *palStack_870;
  ulong local_868;
  ulong uStack_860;
  __m128i *local_858;
  ulong uStack_850;
  ulong local_848;
  ulong uStack_840;
  ulong local_838;
  ulong uStack_830;
  ulong local_828;
  ulong uStack_820;
  ulong local_818;
  ulong uStack_810;
  ulong local_808;
  ulong uStack_800;
  ulong local_7f8;
  ulong uStack_7f0;
  ulong local_7e8;
  ulong uStack_7e0;
  __m128i *local_7d8;
  __m128i *palStack_7d0;
  ulong local_7c8;
  ulong uStack_7c0;
  __m128i *local_7b8;
  __m128i *palStack_7b0;
  ulong local_7a8;
  ulong uStack_7a0;
  __m128i *local_798;
  ulong uStack_790;
  ulong local_788;
  ulong uStack_780;
  __m128i *local_778;
  __m128i *palStack_770;
  ulong local_768;
  ulong uStack_760;
  __m128i *local_758;
  ulong uStack_750;
  ulong local_748;
  ulong uStack_740;
  ulong local_738;
  ulong uStack_730;
  ulong local_728;
  ulong uStack_720;
  __m128i *local_718;
  ulong uStack_710;
  ulong local_708;
  ulong uStack_700;
  ulong local_6f8;
  ulong uStack_6f0;
  ulong local_6e8;
  ulong uStack_6e0;
  __m128i *local_6d8;
  __m128i *palStack_6d0;
  ulong local_6c8;
  ulong uStack_6c0;
  __m128i *local_6b8;
  __m128i *palStack_6b0;
  ulong local_6a8;
  ulong uStack_6a0;
  __m128i *local_698;
  ulong uStack_690;
  ulong local_688;
  ulong uStack_680;
  __m128i *local_678;
  __m128i *palStack_670;
  __m128i **local_660;
  ulong local_658;
  ulong uStack_650;
  ulong *local_640;
  ulong local_638;
  ulong uStack_630;
  ulong *local_620;
  ulong local_618;
  ulong uStack_610;
  ulong *local_600;
  ulong local_5f8;
  ulong uStack_5f0;
  ulong *local_5e0;
  ulong local_5d8;
  ulong uStack_5d0;
  ulong *local_5c0;
  ulong local_5b8;
  ulong uStack_5b0;
  ulong *local_5a0;
  ulong local_598;
  ulong uStack_590;
  ulong *local_580;
  ulong local_578;
  ulong uStack_570;
  ulong *local_560;
  ulong local_558;
  ulong uStack_550;
  ulong *local_540;
  ulong local_538;
  ulong uStack_530;
  ulong *local_520;
  ulong local_518;
  ulong uStack_510;
  ulong *local_500;
  ulong local_4f8;
  ulong uStack_4f0;
  ulong *local_4e0;
  ulong local_4d8;
  ulong uStack_4d0;
  ulong *local_4c0;
  ulong local_4b8;
  ulong uStack_4b0;
  ulong *local_4a0;
  ulong local_498;
  ulong uStack_490;
  ulong *local_480;
  ulong local_478;
  ulong uStack_470;
  ulong *local_460;
  ulong local_458;
  ulong uStack_450;
  ulong *local_440;
  ulong local_438;
  ulong uStack_430;
  ulong *local_420;
  ulong local_418;
  ulong uStack_410;
  ulong *local_400;
  ulong local_3f8;
  ulong uStack_3f0;
  ulong *local_3e0;
  ulong local_3d8;
  ulong uStack_3d0;
  ulong *local_3c0;
  ulong local_3b8;
  ulong uStack_3b0;
  ulong *local_3a0;
  ulong local_398;
  ulong uStack_390;
  ulong *local_380;
  ulong local_378;
  ulong uStack_370;
  ulong *local_360;
  ulong local_358;
  ulong uStack_350;
  ulong *local_340;
  ulong local_338;
  ulong uStack_330;
  ulong *local_320;
  ulong local_318;
  ulong uStack_310;
  ulong *local_300;
  ulong local_2f8;
  ulong uStack_2f0;
  ulong *local_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong *local_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong *local_2a0;
  ulong local_298;
  ulong uStack_290;
  ulong *local_280;
  ulong local_278;
  ulong uStack_270;
  ulong *local_260;
  ulong local_258;
  ulong uStack_250;
  ulong *local_240;
  ulong local_238;
  ulong uStack_230;
  ulong *local_220;
  ulong local_218;
  ulong uStack_210;
  ulong *local_200;
  ulong local_1f8;
  ulong uStack_1f0;
  ulong *local_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  ulong *local_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  ulong *local_1a0;
  ulong local_198;
  ulong uStack_190;
  ulong *local_180;
  ulong local_178;
  ulong uStack_170;
  ulong *local_160;
  ulong local_158;
  ulong uStack_150;
  ulong *local_140;
  ulong local_138;
  ulong uStack_130;
  ulong *local_120;
  ulong local_118;
  ulong uStack_110;
  ulong *local_100;
  ulong local_f8;
  ulong uStack_f0;
  ulong *local_e0;
  __m128i *local_d8;
  ulong uStack_d0;
  ulong *local_c0;
  ulong local_b8;
  ulong uStack_b0;
  ulong *local_a0;
  ulong local_98;
  ulong uStack_90;
  ulong *local_80;
  __m128i *local_78;
  __m128i *palStack_70;
  ulong *local_60;
  __m128i *local_58;
  __m128i *palStack_50;
  ulong *local_40;
  __m128i *local_38;
  ulong uStack_30;
  ulong *local_20;
  __m128i *local_18;
  __m128i *palStack_10;
  ulong *local_8;
  
  local_1b68 = 0;
  uStack_1b60 = 0;
  xmm_crc2_00 = (__m128i *)0x0;
  xmm_crc1_00 = (__m128i *)0x0;
  local_1b88 = in_RCX;
  local_1b80 = in_RDX;
  local_1b78 = in_RSI;
  local_1b70 = in_RDI;
  memset(&local_1c38,0,0x10);
  crc32_fold_load(local_1b70,(__m128i *)&local_1be8,(__m128i *)&local_1bf8,(__m128i *)&local_1c08,
                  (__m128i *)&stack0xffffffffffffe3e8);
  if (local_1b88 < 0x10) {
    if (local_1b88 == 0) {
      return;
    }
    memcpy(&local_1c38,local_1b80,local_1b88);
    local_1b08 = &local_1c38;
    xmm_crc2_00 = local_1c38;
    memcpy(local_1b78,&local_1c38,local_1b88);
    xmm_crc1_00 = in_stack_ffffffffffffe3d0;
  }
  else {
    local_1b90 = 0x10 - ((ulong)local_1b80 & 0xf) & 0xf;
    if (local_1b90 != 0) {
      local_19c0 = local_1b80;
      xmm_crc2_00 = (__m128i *)*local_1b80;
      xmm_crc1_00 = (__m128i *)local_1b80[1];
      local_8 = local_1b78;
      *local_1b78 = (ulong)xmm_crc2_00;
      local_1b78[1] = (ulong)xmm_crc1_00;
      local_1b78 = (ulong *)(local_1b90 + (long)local_1b78);
      local_18 = xmm_crc2_00;
      palStack_10 = xmm_crc1_00;
      partial_fold(in_stack_ffffffffffffe3c0,in_stack_ffffffffffffe3b8,in_stack_ffffffffffffe3b0,
                   in_stack_ffffffffffffe3a8,in_stack_ffffffffffffe3a0,in_stack_ffffffffffffe398);
      local_1b80 = (ulong *)(local_1b90 + (long)local_1b80);
      local_1b88 = local_1b88 - local_1b90;
    }
    for (; 0x2bf < local_1b88; local_1b88 = local_1b88 - 0x200) {
      local_19c8 = local_1b80;
      in_stack_ffffffffffffe3b8 = (__m128i *)*local_1b80;
      in_stack_ffffffffffffe3c0 = local_1b80[1];
      local_19d0 = local_1b80 + 2;
      in_stack_ffffffffffffe3a8 = (__m128i *)*local_19d0;
      in_stack_ffffffffffffe3b0 = (__m128i *)local_1b80[3];
      local_19d8 = local_1b80 + 4;
      in_stack_ffffffffffffe398 = (__m128i *)*local_19d8;
      in_stack_ffffffffffffe3a0 = (__m128i *)local_1b80[5];
      local_19e0 = local_1b80 + 6;
      uVar1 = *local_19e0;
      uVar2 = local_1b80[7];
      local_19e8 = local_1b80 + 8;
      uVar3 = *local_19e8;
      uVar4 = local_1b80[9];
      local_19f0 = local_1b80 + 10;
      in_stack_ffffffffffffe368 = (__m128i *)*local_19f0;
      uVar5 = local_1b80[0xb];
      local_19f8 = local_1b80 + 0xc;
      local_688 = *local_19f8;
      uStack_680 = local_1b80[0xd];
      local_1a00 = local_1b80 + 0xe;
      local_6a8 = *local_1a00;
      uStack_6a0 = local_1b80[0xf];
      local_20 = local_1b78;
      *local_1b78 = (ulong)in_stack_ffffffffffffe3b8;
      local_1b78[1] = in_stack_ffffffffffffe3c0;
      local_40 = local_1b78 + 2;
      *local_40 = (ulong)in_stack_ffffffffffffe3a8;
      local_1b78[3] = (ulong)in_stack_ffffffffffffe3b0;
      local_60 = local_1b78 + 4;
      *local_60 = (ulong)in_stack_ffffffffffffe398;
      local_1b78[5] = (ulong)in_stack_ffffffffffffe3a0;
      local_80 = local_1b78 + 6;
      *local_80 = uVar1;
      local_1b78[7] = uVar2;
      local_a0 = local_1b78 + 8;
      *local_a0 = uVar3;
      local_1b78[9] = uVar4;
      local_c0 = local_1b78 + 10;
      *local_c0 = (ulong)in_stack_ffffffffffffe368;
      local_1b78[0xb] = uVar5;
      local_e0 = local_1b78 + 0xc;
      *local_e0 = local_688;
      local_1b78[0xd] = uStack_680;
      local_100 = local_1b78 + 0xe;
      *local_100 = local_6a8;
      local_1b78[0xf] = uStack_6a0;
      local_1b78 = local_1b78 + 0x10;
      in_stack_ffffffffffffe358 = (__m128i *)(local_688 ^ (ulong)in_stack_ffffffffffffe3b8);
      in_stack_ffffffffffffe360 = (__m128i *)(uStack_680 ^ in_stack_ffffffffffffe3c0);
      uVar6 = local_6a8 ^ (ulong)in_stack_ffffffffffffe3a8;
      in_stack_ffffffffffffe350 = (__m128i *)(uStack_6a0 ^ (ulong)in_stack_ffffffffffffe3b0);
      local_1a08 = local_1b80 + 0x10;
      local_1b88 = local_1b88 - 0x80;
      local_1ba8 = *local_1a08;
      uStack_1ba0 = local_1b80[0x11];
      local_1a10 = local_1b80 + 0x12;
      local_1bb8 = *local_1a10;
      uStack_1bb0 = local_1b80[0x13];
      local_1a18 = local_1b80 + 0x14;
      local_1bc8 = *local_1a18;
      uStack_1bc0 = local_1b80[0x15];
      local_1a20 = local_1b80 + 0x16;
      local_1bd8 = *local_1a20;
      uStack_1bd0 = local_1b80[0x17];
      local_1b80 = local_1a08;
      local_6b8 = in_stack_ffffffffffffe3a8;
      palStack_6b0 = in_stack_ffffffffffffe3b0;
      local_698 = in_stack_ffffffffffffe3b8;
      uStack_690 = in_stack_ffffffffffffe3c0;
      local_118 = local_6a8;
      uStack_110 = uStack_6a0;
      local_f8 = local_688;
      uStack_f0 = uStack_680;
      local_d8 = in_stack_ffffffffffffe368;
      uStack_d0 = uVar5;
      local_b8 = uVar3;
      uStack_b0 = uVar4;
      local_98 = uVar1;
      uStack_90 = uVar2;
      local_78 = in_stack_ffffffffffffe398;
      palStack_70 = in_stack_ffffffffffffe3a0;
      local_58 = in_stack_ffffffffffffe3a8;
      palStack_50 = in_stack_ffffffffffffe3b0;
      local_38 = in_stack_ffffffffffffe3b8;
      uStack_30 = in_stack_ffffffffffffe3c0;
      fold_12(in_stack_ffffffffffffe3e8,xmm_crc1_00,xmm_crc2_00,in_stack_ffffffffffffe3d0);
      local_120 = local_1b78;
      local_138 = local_1ba8;
      uStack_130 = uStack_1ba0;
      *local_1b78 = local_1ba8;
      local_1b78[1] = uStack_1ba0;
      local_140 = local_1b78 + 2;
      local_158 = local_1bb8;
      uStack_150 = uStack_1bb0;
      *local_140 = local_1bb8;
      local_1b78[3] = uStack_1bb0;
      local_160 = local_1b78 + 4;
      local_178 = local_1bc8;
      uStack_170 = uStack_1bc0;
      *local_160 = local_1bc8;
      local_1b78[5] = uStack_1bc0;
      local_180 = local_1b78 + 6;
      local_198 = local_1bd8;
      uStack_190 = uStack_1bd0;
      *local_180 = local_1bd8;
      local_1b78[7] = uStack_1bd0;
      local_1b78 = local_1b78 + 8;
      local_6c8 = local_1ba8;
      uStack_6c0 = uStack_1ba0;
      local_7e8 = local_1ba8 ^ (ulong)in_stack_ffffffffffffe398;
      uStack_7e0 = uStack_1ba0 ^ (ulong)in_stack_ffffffffffffe3a0;
      local_6e8 = local_1bb8;
      uStack_6e0 = uStack_1bb0;
      local_708 = local_1bb8 ^ uVar1;
      uStack_700 = uStack_1bb0 ^ uVar2;
      local_808 = local_708 ^ (ulong)in_stack_ffffffffffffe3b8;
      uStack_800 = uStack_700 ^ in_stack_ffffffffffffe3c0;
      local_728 = local_1bc8;
      uStack_720 = uStack_1bc0;
      local_748 = local_1bc8 ^ uVar3;
      uStack_740 = uStack_1bc0 ^ uVar4;
      local_768 = local_748 ^ (ulong)in_stack_ffffffffffffe3b8;
      uStack_760 = uStack_740 ^ in_stack_ffffffffffffe3c0;
      local_828 = local_768 ^ (ulong)in_stack_ffffffffffffe3a8;
      uStack_820 = uStack_760 ^ (ulong)in_stack_ffffffffffffe3b0;
      local_788 = local_1bd8;
      uStack_780 = uStack_1bd0;
      local_7a8 = local_1bd8 ^ (ulong)in_stack_ffffffffffffe368;
      uStack_7a0 = uStack_1bd0 ^ uVar5;
      local_7c8 = local_7a8 ^ (ulong)in_stack_ffffffffffffe3a8;
      uStack_7c0 = uStack_7a0 ^ (ulong)in_stack_ffffffffffffe3b0;
      local_848 = local_7c8 ^ (ulong)in_stack_ffffffffffffe398;
      uStack_840 = uStack_7c0 ^ (ulong)in_stack_ffffffffffffe3a0;
      local_7f8 = local_1be8;
      uStack_7f0 = uStack_1be0;
      local_1be8 = local_7e8 ^ local_1be8;
      uStack_1be0 = uStack_7e0 ^ uStack_1be0;
      local_818 = local_1bf8;
      uStack_810 = uStack_1bf0;
      local_1bf8 = local_808 ^ local_1bf8;
      uStack_1bf0 = uStack_800 ^ uStack_1bf0;
      local_838 = local_1c08;
      uStack_830 = uStack_1c00;
      local_1c08 = local_828 ^ local_1c08;
      uStack_1c00 = uStack_820 ^ uStack_1c00;
      uStack_850 = uStack_1c10;
      palVar7 = (__m128i *)(local_848 ^ (ulong)in_stack_ffffffffffffe3e8);
      uVar9 = uStack_840 ^ uStack_1c10;
      local_1a28 = local_1b80 + 8;
      local_1ba8 = *local_1a28;
      uStack_1ba0 = local_1b80[9];
      local_1a30 = local_1b80 + 10;
      local_1bb8 = *local_1a30;
      uStack_1bb0 = local_1b80[0xb];
      local_1a38 = local_1b80 + 0xc;
      local_1bc8 = *local_1a38;
      uStack_1bc0 = local_1b80[0xd];
      local_1a40 = local_1b80 + 0xe;
      local_1bd8 = *local_1a40;
      uStack_1bd0 = local_1b80[0xf];
      local_858 = in_stack_ffffffffffffe3e8;
      local_7d8 = in_stack_ffffffffffffe398;
      palStack_7d0 = in_stack_ffffffffffffe3a0;
      local_7b8 = in_stack_ffffffffffffe3a8;
      palStack_7b0 = in_stack_ffffffffffffe3b0;
      local_798 = in_stack_ffffffffffffe368;
      uStack_790 = uVar5;
      local_778 = in_stack_ffffffffffffe3a8;
      palStack_770 = in_stack_ffffffffffffe3b0;
      local_758 = in_stack_ffffffffffffe3b8;
      uStack_750 = in_stack_ffffffffffffe3c0;
      local_738 = uVar3;
      uStack_730 = uVar4;
      local_718 = in_stack_ffffffffffffe3b8;
      uStack_710 = in_stack_ffffffffffffe3c0;
      local_6f8 = uVar1;
      uStack_6f0 = uVar2;
      local_6d8 = in_stack_ffffffffffffe398;
      palStack_6d0 = in_stack_ffffffffffffe3a0;
      fold_4(palVar7,xmm_crc1_00,xmm_crc2_00,in_stack_ffffffffffffe3d0);
      local_1a0 = local_1b78;
      local_1b8 = local_1ba8;
      uStack_1b0 = uStack_1ba0;
      *local_1b78 = local_1ba8;
      local_1b78[1] = uStack_1ba0;
      local_1c0 = local_1b78 + 2;
      local_1d8 = local_1bb8;
      uStack_1d0 = uStack_1bb0;
      *local_1c0 = local_1bb8;
      local_1b78[3] = uStack_1bb0;
      local_1e0 = local_1b78 + 4;
      local_1f8 = local_1bc8;
      uStack_1f0 = uStack_1bc0;
      *local_1e0 = local_1bc8;
      local_1b78[5] = uStack_1bc0;
      local_200 = local_1b78 + 6;
      local_218 = local_1bd8;
      uStack_210 = uStack_1bd0;
      *local_200 = local_1bd8;
      local_1b78[7] = uStack_1bd0;
      local_1b78 = local_1b78 + 8;
      local_868 = local_1ba8;
      uStack_860 = uStack_1ba0;
      local_888 = local_1ba8 ^ (ulong)in_stack_ffffffffffffe358;
      uStack_880 = uStack_1ba0 ^ (ulong)in_stack_ffffffffffffe360;
      local_8a8 = local_888 ^ (ulong)in_stack_ffffffffffffe398;
      uStack_8a0 = uStack_880 ^ (ulong)in_stack_ffffffffffffe3a0;
      local_9a8 = local_8a8 ^ uVar1;
      uStack_9a0 = uStack_8a0 ^ uVar2;
      local_8c8 = local_1bb8;
      uStack_8c0 = uStack_1bb0;
      local_8e8 = local_1bb8 ^ uVar6;
      uStack_8e0 = uStack_1bb0 ^ (ulong)in_stack_ffffffffffffe350;
      local_908 = local_8e8 ^ uVar3;
      uStack_900 = uStack_8e0 ^ uVar4;
      local_9c8 = local_908 ^ uVar1;
      uStack_9c0 = uStack_900 ^ uVar2;
      local_928 = local_1bc8;
      uStack_920 = uStack_1bc0;
      local_948 = local_1bc8 ^ (ulong)in_stack_ffffffffffffe368;
      uStack_940 = uStack_1bc0 ^ uVar5;
      local_9e8 = local_948 ^ uVar3;
      uStack_9e0 = uStack_940 ^ uVar4;
      local_968 = local_1bd8;
      uStack_960 = uStack_1bd0;
      local_988 = local_1bd8 ^ (ulong)in_stack_ffffffffffffe358;
      uStack_980 = uStack_1bd0 ^ (ulong)in_stack_ffffffffffffe360;
      local_a08 = local_988 ^ (ulong)in_stack_ffffffffffffe368;
      uStack_a00 = uStack_980 ^ uVar5;
      local_9b8 = local_1be8;
      uStack_9b0 = uStack_1be0;
      local_1be8 = local_9a8 ^ local_1be8;
      uStack_1be0 = uStack_9a0 ^ uStack_1be0;
      local_9d8 = local_1bf8;
      uStack_9d0 = uStack_1bf0;
      local_1bf8 = local_9c8 ^ local_1bf8;
      uStack_1bf0 = uStack_9c0 ^ uStack_1bf0;
      local_9f8 = local_1c08;
      uStack_9f0 = uStack_1c00;
      local_1c08 = local_9e8 ^ local_1c08;
      uStack_1c00 = uStack_9e0 ^ uStack_1c00;
      palVar8 = (__m128i *)(local_a08 ^ (ulong)palVar7);
      uVar10 = uStack_a00 ^ uVar9;
      local_1a48 = local_1b80 + 0x10;
      local_1ba8 = *local_1a48;
      uStack_1ba0 = local_1b80[0x11];
      local_1a50 = local_1b80 + 0x12;
      local_1bb8 = *local_1a50;
      uStack_1bb0 = local_1b80[0x13];
      local_1a58 = local_1b80 + 0x14;
      local_1bc8 = *local_1a58;
      uStack_1bc0 = local_1b80[0x15];
      local_1a60 = local_1b80 + 0x16;
      local_1bd8 = *local_1a60;
      uStack_1bd0 = local_1b80[0x17];
      local_a18 = palVar7;
      uStack_a10 = uVar9;
      local_998 = in_stack_ffffffffffffe368;
      uStack_990 = uVar5;
      local_978 = in_stack_ffffffffffffe358;
      palStack_970 = in_stack_ffffffffffffe360;
      local_958 = uVar3;
      uStack_950 = uVar4;
      local_938 = in_stack_ffffffffffffe368;
      uStack_930 = uVar5;
      local_918 = uVar1;
      uStack_910 = uVar2;
      local_8f8 = uVar3;
      uStack_8f0 = uVar4;
      local_8d8 = uVar6;
      palStack_8d0 = in_stack_ffffffffffffe350;
      local_8b8 = uVar1;
      uStack_8b0 = uVar2;
      local_898 = in_stack_ffffffffffffe398;
      palStack_890 = in_stack_ffffffffffffe3a0;
      local_878 = in_stack_ffffffffffffe358;
      palStack_870 = in_stack_ffffffffffffe360;
      fold_4(palVar8,xmm_crc1_00,xmm_crc2_00,in_stack_ffffffffffffe3d0);
      local_220 = local_1b78;
      local_238 = local_1ba8;
      uStack_230 = uStack_1ba0;
      *local_1b78 = local_1ba8;
      local_1b78[1] = uStack_1ba0;
      local_240 = local_1b78 + 2;
      local_258 = local_1bb8;
      uStack_250 = uStack_1bb0;
      *local_240 = local_1bb8;
      local_1b78[3] = uStack_1bb0;
      local_260 = local_1b78 + 4;
      local_278 = local_1bc8;
      uStack_270 = uStack_1bc0;
      *local_260 = local_1bc8;
      local_1b78[5] = uStack_1bc0;
      local_280 = local_1b78 + 6;
      local_298 = local_1bd8;
      uStack_290 = uStack_1bd0;
      *local_280 = local_1bd8;
      local_1b78[7] = uStack_1bd0;
      local_1b78 = local_1b78 + 8;
      local_a28 = local_1ba8;
      uStack_a20 = uStack_1ba0;
      local_a48 = local_1ba8 ^ uVar6;
      uStack_a40 = uStack_1ba0 ^ (ulong)in_stack_ffffffffffffe350;
      local_a68 = local_a48 ^ (ulong)in_stack_ffffffffffffe358;
      uStack_a60 = uStack_a40 ^ (ulong)in_stack_ffffffffffffe360;
      local_b08 = local_a68 ^ (ulong)in_stack_ffffffffffffe3b8;
      uStack_b00 = uStack_a60 ^ in_stack_ffffffffffffe3c0;
      local_a88 = local_1bb8;
      uStack_a80 = uStack_1bb0;
      local_aa8 = local_1bb8 ^ uVar6;
      uStack_aa0 = uStack_1bb0 ^ (ulong)in_stack_ffffffffffffe350;
      local_b28 = local_aa8 ^ (ulong)in_stack_ffffffffffffe3a8;
      uStack_b20 = uStack_aa0 ^ (ulong)in_stack_ffffffffffffe3b0;
      local_ac8 = local_1bc8;
      uStack_ac0 = uStack_1bc0;
      local_b48 = local_1bc8 ^ (ulong)in_stack_ffffffffffffe398;
      uStack_b40 = uStack_1bc0 ^ (ulong)in_stack_ffffffffffffe3a0;
      local_ae8 = local_1bd8;
      uStack_ae0 = uStack_1bd0;
      local_b68 = local_1bd8 ^ uVar1;
      uStack_b60 = uStack_1bd0 ^ uVar2;
      local_b18 = local_1be8;
      uStack_b10 = uStack_1be0;
      local_1be8 = local_b08 ^ local_1be8;
      uStack_1be0 = uStack_b00 ^ uStack_1be0;
      local_b38 = local_1bf8;
      uStack_b30 = uStack_1bf0;
      local_1bf8 = local_b28 ^ local_1bf8;
      uStack_1bf0 = uStack_b20 ^ uStack_1bf0;
      local_b58 = local_1c08;
      uStack_b50 = uStack_1c00;
      local_1c08 = local_b48 ^ local_1c08;
      uStack_1c00 = uStack_b40 ^ uStack_1c00;
      palVar7 = (__m128i *)(local_b68 ^ (ulong)palVar8);
      uVar9 = uStack_b60 ^ uVar10;
      local_1a68 = local_1b80 + 0x18;
      local_1ba8 = *local_1a68;
      uStack_1ba0 = local_1b80[0x19];
      local_1a70 = local_1b80 + 0x1a;
      local_1bb8 = *local_1a70;
      uStack_1bb0 = local_1b80[0x1b];
      local_1a78 = local_1b80 + 0x1c;
      local_1bc8 = *local_1a78;
      uStack_1bc0 = local_1b80[0x1d];
      local_1a80 = local_1b80 + 0x1e;
      local_1bd8 = *local_1a80;
      uStack_1bd0 = local_1b80[0x1f];
      local_b78 = palVar8;
      uStack_b70 = uVar10;
      local_af8 = uVar1;
      uStack_af0 = uVar2;
      local_ad8 = in_stack_ffffffffffffe398;
      palStack_ad0 = in_stack_ffffffffffffe3a0;
      local_ab8 = in_stack_ffffffffffffe3a8;
      palStack_ab0 = in_stack_ffffffffffffe3b0;
      local_a98 = uVar6;
      palStack_a90 = in_stack_ffffffffffffe350;
      local_a78 = in_stack_ffffffffffffe3b8;
      uStack_a70 = in_stack_ffffffffffffe3c0;
      local_a58 = in_stack_ffffffffffffe358;
      palStack_a50 = in_stack_ffffffffffffe360;
      local_a38 = uVar6;
      palStack_a30 = in_stack_ffffffffffffe350;
      fold_4(palVar7,xmm_crc1_00,xmm_crc2_00,in_stack_ffffffffffffe3d0);
      local_2a0 = local_1b78;
      local_2b8 = local_1ba8;
      uStack_2b0 = uStack_1ba0;
      *local_1b78 = local_1ba8;
      local_1b78[1] = uStack_1ba0;
      local_2c0 = local_1b78 + 2;
      local_2d8 = local_1bb8;
      uStack_2d0 = uStack_1bb0;
      *local_2c0 = local_1bb8;
      local_1b78[3] = uStack_1bb0;
      local_2e0 = local_1b78 + 4;
      local_2f8 = local_1bc8;
      uStack_2f0 = uStack_1bc0;
      *local_2e0 = local_1bc8;
      local_1b78[5] = uStack_1bc0;
      local_300 = local_1b78 + 6;
      local_318 = local_1bd8;
      uStack_310 = uStack_1bd0;
      *local_300 = local_1bd8;
      local_1b78[7] = uStack_1bd0;
      local_1b78 = local_1b78 + 8;
      local_b88 = local_1ba8;
      uStack_b80 = uStack_1ba0;
      local_ba8 = local_1ba8 ^ uVar3;
      uStack_ba0 = uStack_1ba0 ^ uVar4;
      local_d28 = local_ba8 ^ (ulong)in_stack_ffffffffffffe3b8;
      uStack_d20 = uStack_ba0 ^ in_stack_ffffffffffffe3c0;
      local_bc8 = local_1bb8;
      uStack_bc0 = uStack_1bb0;
      local_be8 = local_1bb8 ^ (ulong)in_stack_ffffffffffffe368;
      uStack_be0 = uStack_1bb0 ^ uVar5;
      local_c08 = local_be8 ^ (ulong)in_stack_ffffffffffffe3b8;
      uStack_c00 = uStack_be0 ^ in_stack_ffffffffffffe3c0;
      local_d48 = local_c08 ^ (ulong)in_stack_ffffffffffffe3a8;
      uStack_d40 = uStack_c00 ^ (ulong)in_stack_ffffffffffffe3b0;
      local_c28 = local_1bc8;
      uStack_c20 = uStack_1bc0;
      local_c48 = local_1bc8 ^ (ulong)in_stack_ffffffffffffe358;
      uStack_c40 = uStack_1bc0 ^ (ulong)in_stack_ffffffffffffe360;
      local_c68 = local_c48 ^ (ulong)in_stack_ffffffffffffe3b8;
      uStack_c60 = uStack_c40 ^ in_stack_ffffffffffffe3c0;
      local_c88 = local_c68 ^ (ulong)in_stack_ffffffffffffe3a8;
      uStack_c80 = uStack_c60 ^ (ulong)in_stack_ffffffffffffe3b0;
      local_d68 = local_c88 ^ (ulong)in_stack_ffffffffffffe398;
      uStack_d60 = uStack_c80 ^ (ulong)in_stack_ffffffffffffe3a0;
      local_ca8 = local_1bd8;
      uStack_ca0 = uStack_1bd0;
      local_cc8 = local_1bd8 ^ uVar6;
      uStack_cc0 = uStack_1bd0 ^ (ulong)in_stack_ffffffffffffe350;
      local_ce8 = local_cc8 ^ (ulong)in_stack_ffffffffffffe3a8;
      uStack_ce0 = uStack_cc0 ^ (ulong)in_stack_ffffffffffffe3b0;
      local_d08 = local_ce8 ^ (ulong)in_stack_ffffffffffffe398;
      uStack_d00 = uStack_ce0 ^ (ulong)in_stack_ffffffffffffe3a0;
      local_d88 = local_d08 ^ uVar1;
      uStack_d80 = uStack_d00 ^ uVar2;
      local_d38 = local_1be8;
      uStack_d30 = uStack_1be0;
      local_1be8 = local_d28 ^ local_1be8;
      uStack_1be0 = uStack_d20 ^ uStack_1be0;
      local_d58 = local_1bf8;
      uStack_d50 = uStack_1bf0;
      local_1bf8 = local_d48 ^ local_1bf8;
      uStack_1bf0 = uStack_d40 ^ uStack_1bf0;
      local_d78 = local_1c08;
      uStack_d70 = uStack_1c00;
      local_1c08 = local_d68 ^ local_1c08;
      uStack_1c00 = uStack_d60 ^ uStack_1c00;
      palVar8 = (__m128i *)(local_d88 ^ (ulong)palVar7);
      uVar10 = uStack_d80 ^ uVar9;
      local_1a88 = local_1b80 + 0x20;
      local_1ba8 = *local_1a88;
      uStack_1ba0 = local_1b80[0x21];
      local_1a90 = local_1b80 + 0x22;
      local_1bb8 = *local_1a90;
      uStack_1bb0 = local_1b80[0x23];
      local_1a98 = local_1b80 + 0x24;
      local_1bc8 = *local_1a98;
      uStack_1bc0 = local_1b80[0x25];
      local_1aa0 = local_1b80 + 0x26;
      local_1bd8 = *local_1aa0;
      uStack_1bd0 = local_1b80[0x27];
      local_d98 = palVar7;
      uStack_d90 = uVar9;
      local_d18 = uVar1;
      uStack_d10 = uVar2;
      local_cf8 = in_stack_ffffffffffffe398;
      palStack_cf0 = in_stack_ffffffffffffe3a0;
      local_cd8 = in_stack_ffffffffffffe3a8;
      palStack_cd0 = in_stack_ffffffffffffe3b0;
      local_cb8 = uVar6;
      palStack_cb0 = in_stack_ffffffffffffe350;
      local_c98 = in_stack_ffffffffffffe398;
      palStack_c90 = in_stack_ffffffffffffe3a0;
      local_c78 = in_stack_ffffffffffffe3a8;
      palStack_c70 = in_stack_ffffffffffffe3b0;
      local_c58 = in_stack_ffffffffffffe3b8;
      uStack_c50 = in_stack_ffffffffffffe3c0;
      local_c38 = in_stack_ffffffffffffe358;
      palStack_c30 = in_stack_ffffffffffffe360;
      local_c18 = in_stack_ffffffffffffe3a8;
      palStack_c10 = in_stack_ffffffffffffe3b0;
      local_bf8 = in_stack_ffffffffffffe3b8;
      uStack_bf0 = in_stack_ffffffffffffe3c0;
      local_bd8 = in_stack_ffffffffffffe368;
      uStack_bd0 = uVar5;
      local_bb8 = in_stack_ffffffffffffe3b8;
      uStack_bb0 = in_stack_ffffffffffffe3c0;
      local_b98 = uVar3;
      uStack_b90 = uVar4;
      fold_4(palVar8,xmm_crc1_00,xmm_crc2_00,in_stack_ffffffffffffe3d0);
      local_320 = local_1b78;
      local_338 = local_1ba8;
      uStack_330 = uStack_1ba0;
      *local_1b78 = local_1ba8;
      local_1b78[1] = uStack_1ba0;
      local_340 = local_1b78 + 2;
      local_358 = local_1bb8;
      uStack_350 = uStack_1bb0;
      *local_340 = local_1bb8;
      local_1b78[3] = uStack_1bb0;
      local_360 = local_1b78 + 4;
      local_378 = local_1bc8;
      uStack_370 = uStack_1bc0;
      *local_360 = local_1bc8;
      local_1b78[5] = uStack_1bc0;
      local_380 = local_1b78 + 6;
      local_398 = local_1bd8;
      uStack_390 = uStack_1bd0;
      *local_380 = local_1bd8;
      local_1b78[7] = uStack_1bd0;
      local_1b78 = local_1b78 + 8;
      local_da8 = local_1ba8;
      uStack_da0 = uStack_1ba0;
      local_dc8 = local_1ba8 ^ uVar3;
      uStack_dc0 = uStack_1ba0 ^ uVar4;
      local_de8 = local_dc8 ^ (ulong)in_stack_ffffffffffffe3b8;
      uStack_de0 = uStack_dc0 ^ in_stack_ffffffffffffe3c0;
      local_e08 = local_de8 ^ (ulong)in_stack_ffffffffffffe398;
      uStack_e00 = uStack_de0 ^ (ulong)in_stack_ffffffffffffe3a0;
      local_1028 = local_e08 ^ uVar1;
      uStack_1020 = uStack_e00 ^ uVar2;
      local_e28 = local_1bb8;
      uStack_e20 = uStack_1bb0;
      local_e48 = local_1bb8 ^ (ulong)in_stack_ffffffffffffe368;
      uStack_e40 = uStack_1bb0 ^ uVar5;
      local_e68 = local_e48 ^ uVar3;
      uStack_e60 = uStack_e40 ^ uVar4;
      local_e88 = local_e68 ^ (ulong)in_stack_ffffffffffffe3b8;
      uStack_e80 = uStack_e60 ^ in_stack_ffffffffffffe3c0;
      local_ea8 = local_e88 ^ (ulong)in_stack_ffffffffffffe3a8;
      uStack_ea0 = uStack_e80 ^ (ulong)in_stack_ffffffffffffe3b0;
      local_1048 = local_ea8 ^ uVar1;
      uStack_1040 = uStack_ea0 ^ uVar2;
      local_ec8 = local_1bc8;
      uStack_ec0 = uStack_1bc0;
      local_ee8 = local_1bc8 ^ (ulong)in_stack_ffffffffffffe358;
      uStack_ee0 = uStack_1bc0 ^ (ulong)in_stack_ffffffffffffe360;
      local_f08 = local_ee8 ^ (ulong)in_stack_ffffffffffffe368;
      uStack_f00 = uStack_ee0 ^ uVar5;
      local_f28 = local_f08 ^ uVar3;
      uStack_f20 = uStack_f00 ^ uVar4;
      local_f48 = local_f28 ^ (ulong)in_stack_ffffffffffffe3a8;
      uStack_f40 = uStack_f20 ^ (ulong)in_stack_ffffffffffffe3b0;
      local_1068 = local_f48 ^ (ulong)in_stack_ffffffffffffe398;
      uStack_1060 = uStack_f40 ^ (ulong)in_stack_ffffffffffffe3a0;
      local_f68 = local_1bd8;
      uStack_f60 = uStack_1bd0;
      local_f88 = local_1bd8 ^ uVar6;
      uStack_f80 = uStack_1bd0 ^ (ulong)in_stack_ffffffffffffe350;
      local_fa8 = local_f88 ^ (ulong)in_stack_ffffffffffffe358;
      uStack_fa0 = uStack_f80 ^ (ulong)in_stack_ffffffffffffe360;
      local_fc8 = local_fa8 ^ (ulong)in_stack_ffffffffffffe368;
      uStack_fc0 = uStack_fa0 ^ uVar5;
      local_fe8 = local_fc8 ^ (ulong)in_stack_ffffffffffffe3b8;
      uStack_fe0 = uStack_fc0 ^ in_stack_ffffffffffffe3c0;
      local_1008 = local_fe8 ^ (ulong)in_stack_ffffffffffffe398;
      uStack_1000 = uStack_fe0 ^ (ulong)in_stack_ffffffffffffe3a0;
      local_1088 = local_1008 ^ uVar1;
      uStack_1080 = uStack_1000 ^ uVar2;
      local_1038 = local_1be8;
      uStack_1030 = uStack_1be0;
      local_1be8 = local_1028 ^ local_1be8;
      uStack_1be0 = uStack_1020 ^ uStack_1be0;
      local_1058 = local_1bf8;
      uStack_1050 = uStack_1bf0;
      local_1bf8 = local_1048 ^ local_1bf8;
      uStack_1bf0 = uStack_1040 ^ uStack_1bf0;
      local_1078 = local_1c08;
      uStack_1070 = uStack_1c00;
      local_1c08 = local_1068 ^ local_1c08;
      uStack_1c00 = uStack_1060 ^ uStack_1c00;
      palVar7 = (__m128i *)(local_1088 ^ (ulong)palVar8);
      uVar9 = uStack_1080 ^ uVar10;
      local_1aa8 = local_1b80 + 0x28;
      local_1ba8 = *local_1aa8;
      uStack_1ba0 = local_1b80[0x29];
      local_1ab0 = local_1b80 + 0x2a;
      local_1bb8 = *local_1ab0;
      uStack_1bb0 = local_1b80[0x2b];
      local_1ab8 = local_1b80 + 0x2c;
      local_1bc8 = *local_1ab8;
      uStack_1bc0 = local_1b80[0x2d];
      local_1ac0 = local_1b80 + 0x2e;
      local_1bd8 = *local_1ac0;
      uStack_1bd0 = local_1b80[0x2f];
      local_1098 = palVar8;
      uStack_1090 = uVar10;
      local_1018 = uVar1;
      uStack_1010 = uVar2;
      local_ff8 = in_stack_ffffffffffffe398;
      palStack_ff0 = in_stack_ffffffffffffe3a0;
      local_fd8 = in_stack_ffffffffffffe3b8;
      uStack_fd0 = in_stack_ffffffffffffe3c0;
      local_fb8 = in_stack_ffffffffffffe368;
      uStack_fb0 = uVar5;
      local_f98 = in_stack_ffffffffffffe358;
      palStack_f90 = in_stack_ffffffffffffe360;
      local_f78 = uVar6;
      palStack_f70 = in_stack_ffffffffffffe350;
      local_f58 = in_stack_ffffffffffffe398;
      palStack_f50 = in_stack_ffffffffffffe3a0;
      local_f38 = in_stack_ffffffffffffe3a8;
      palStack_f30 = in_stack_ffffffffffffe3b0;
      local_f18 = uVar3;
      uStack_f10 = uVar4;
      local_ef8 = in_stack_ffffffffffffe368;
      uStack_ef0 = uVar5;
      local_ed8 = in_stack_ffffffffffffe358;
      palStack_ed0 = in_stack_ffffffffffffe360;
      local_eb8 = uVar1;
      uStack_eb0 = uVar2;
      local_e98 = in_stack_ffffffffffffe3a8;
      palStack_e90 = in_stack_ffffffffffffe3b0;
      local_e78 = in_stack_ffffffffffffe3b8;
      uStack_e70 = in_stack_ffffffffffffe3c0;
      local_e58 = uVar3;
      uStack_e50 = uVar4;
      local_e38 = in_stack_ffffffffffffe368;
      uStack_e30 = uVar5;
      local_e18 = uVar1;
      uStack_e10 = uVar2;
      local_df8 = in_stack_ffffffffffffe398;
      palStack_df0 = in_stack_ffffffffffffe3a0;
      local_dd8 = in_stack_ffffffffffffe3b8;
      uStack_dd0 = in_stack_ffffffffffffe3c0;
      local_db8 = uVar3;
      uStack_db0 = uVar4;
      fold_4(palVar7,xmm_crc1_00,xmm_crc2_00,in_stack_ffffffffffffe3d0);
      local_3a0 = local_1b78;
      local_3b8 = local_1ba8;
      uStack_3b0 = uStack_1ba0;
      *local_1b78 = local_1ba8;
      local_1b78[1] = uStack_1ba0;
      local_3c0 = local_1b78 + 2;
      local_3d8 = local_1bb8;
      uStack_3d0 = uStack_1bb0;
      *local_3c0 = local_1bb8;
      local_1b78[3] = uStack_1bb0;
      local_3e0 = local_1b78 + 4;
      local_3f8 = local_1bc8;
      uStack_3f0 = uStack_1bc0;
      *local_3e0 = local_1bc8;
      local_1b78[5] = uStack_1bc0;
      local_400 = local_1b78 + 6;
      local_418 = local_1bd8;
      uStack_410 = uStack_1bd0;
      *local_400 = local_1bd8;
      local_1b78[7] = uStack_1bd0;
      local_1b78 = local_1b78 + 8;
      local_10a8 = local_1ba8;
      uStack_10a0 = uStack_1ba0;
      local_10c8 = local_1ba8 ^ uVar6;
      uStack_10c0 = uStack_1ba0 ^ (ulong)in_stack_ffffffffffffe350;
      local_10e8 = local_10c8 ^ (ulong)in_stack_ffffffffffffe358;
      uStack_10e0 = uStack_10c0 ^ (ulong)in_stack_ffffffffffffe360;
      local_1108 = local_10e8 ^ uVar3;
      uStack_1100 = uStack_10e0 ^ uVar4;
      local_1128 = local_1108 ^ (ulong)in_stack_ffffffffffffe3b8;
      uStack_1120 = uStack_1100 ^ in_stack_ffffffffffffe3c0;
      local_1148 = local_1128 ^ (ulong)in_stack_ffffffffffffe3a8;
      uStack_1140 = uStack_1120 ^ (ulong)in_stack_ffffffffffffe3b0;
      local_1368 = local_1148 ^ uVar1;
      uStack_1360 = uStack_1140 ^ uVar2;
      local_1168 = local_1bb8;
      uStack_1160 = uStack_1bb0;
      local_1188 = local_1bb8 ^ uVar6;
      uStack_1180 = uStack_1bb0 ^ (ulong)in_stack_ffffffffffffe350;
      local_11a8 = local_1188 ^ (ulong)in_stack_ffffffffffffe368;
      uStack_11a0 = uStack_1180 ^ uVar5;
      local_11c8 = local_11a8 ^ uVar3;
      uStack_11c0 = uStack_11a0 ^ uVar4;
      local_11e8 = local_11c8 ^ (ulong)in_stack_ffffffffffffe3a8;
      uStack_11e0 = uStack_11c0 ^ (ulong)in_stack_ffffffffffffe3b0;
      local_1388 = local_11e8 ^ (ulong)in_stack_ffffffffffffe398;
      uStack_1380 = uStack_11e0 ^ (ulong)in_stack_ffffffffffffe3a0;
      local_1208 = local_1bc8;
      uStack_1200 = uStack_1bc0;
      local_1228 = local_1bc8 ^ (ulong)in_stack_ffffffffffffe358;
      uStack_1220 = uStack_1bc0 ^ (ulong)in_stack_ffffffffffffe360;
      local_1248 = local_1228 ^ (ulong)in_stack_ffffffffffffe368;
      uStack_1240 = uStack_1220 ^ uVar5;
      local_1268 = local_1248 ^ (ulong)in_stack_ffffffffffffe3b8;
      uStack_1260 = uStack_1240 ^ in_stack_ffffffffffffe3c0;
      local_1288 = local_1268 ^ (ulong)in_stack_ffffffffffffe398;
      uStack_1280 = uStack_1260 ^ (ulong)in_stack_ffffffffffffe3a0;
      local_13a8 = local_1288 ^ uVar1;
      uStack_13a0 = uStack_1280 ^ uVar2;
      local_12a8 = local_1bd8;
      uStack_12a0 = uStack_1bd0;
      local_12c8 = local_1bd8 ^ uVar6;
      uStack_12c0 = uStack_1bd0 ^ (ulong)in_stack_ffffffffffffe350;
      local_12e8 = local_12c8 ^ (ulong)in_stack_ffffffffffffe358;
      uStack_12e0 = uStack_12c0 ^ (ulong)in_stack_ffffffffffffe360;
      local_1308 = local_12e8 ^ uVar3;
      uStack_1300 = uStack_12e0 ^ uVar4;
      local_1328 = local_1308 ^ (ulong)in_stack_ffffffffffffe3b8;
      uStack_1320 = uStack_1300 ^ in_stack_ffffffffffffe3c0;
      local_1348 = local_1328 ^ (ulong)in_stack_ffffffffffffe3a8;
      uStack_1340 = uStack_1320 ^ (ulong)in_stack_ffffffffffffe3b0;
      local_13c8 = local_1348 ^ uVar1;
      uStack_13c0 = uStack_1340 ^ uVar2;
      local_1378 = local_1be8;
      uStack_1370 = uStack_1be0;
      local_1be8 = local_1368 ^ local_1be8;
      uStack_1be0 = uStack_1360 ^ uStack_1be0;
      local_1398 = local_1bf8;
      uStack_1390 = uStack_1bf0;
      local_1bf8 = local_1388 ^ local_1bf8;
      uStack_1bf0 = uStack_1380 ^ uStack_1bf0;
      local_13b8 = local_1c08;
      uStack_13b0 = uStack_1c00;
      local_1c08 = local_13a8 ^ local_1c08;
      uStack_1c00 = uStack_13a0 ^ uStack_1c00;
      palVar8 = (__m128i *)(local_13c8 ^ (ulong)palVar7);
      uVar10 = uStack_13c0 ^ uVar9;
      local_1ac8 = local_1b80 + 0x30;
      local_1ba8 = *local_1ac8;
      uStack_1ba0 = local_1b80[0x31];
      local_1ad0 = local_1b80 + 0x32;
      local_1bb8 = *local_1ad0;
      uStack_1bb0 = local_1b80[0x33];
      local_1ad8 = local_1b80 + 0x34;
      local_1bc8 = *local_1ad8;
      uStack_1bc0 = local_1b80[0x35];
      local_1ae0 = local_1b80 + 0x36;
      local_1bd8 = *local_1ae0;
      uStack_1bd0 = local_1b80[0x37];
      local_13d8 = palVar7;
      uStack_13d0 = uVar9;
      local_1358 = uVar1;
      uStack_1350 = uVar2;
      local_1338 = in_stack_ffffffffffffe3a8;
      palStack_1330 = in_stack_ffffffffffffe3b0;
      local_1318 = in_stack_ffffffffffffe3b8;
      uStack_1310 = in_stack_ffffffffffffe3c0;
      local_12f8 = uVar3;
      uStack_12f0 = uVar4;
      local_12d8 = in_stack_ffffffffffffe358;
      palStack_12d0 = in_stack_ffffffffffffe360;
      local_12b8 = uVar6;
      palStack_12b0 = in_stack_ffffffffffffe350;
      local_1298 = uVar1;
      uStack_1290 = uVar2;
      local_1278 = in_stack_ffffffffffffe398;
      palStack_1270 = in_stack_ffffffffffffe3a0;
      local_1258 = in_stack_ffffffffffffe3b8;
      uStack_1250 = in_stack_ffffffffffffe3c0;
      local_1238 = in_stack_ffffffffffffe368;
      uStack_1230 = uVar5;
      local_1218 = in_stack_ffffffffffffe358;
      palStack_1210 = in_stack_ffffffffffffe360;
      local_11f8 = in_stack_ffffffffffffe398;
      palStack_11f0 = in_stack_ffffffffffffe3a0;
      local_11d8 = in_stack_ffffffffffffe3a8;
      palStack_11d0 = in_stack_ffffffffffffe3b0;
      local_11b8 = uVar3;
      uStack_11b0 = uVar4;
      local_1198 = in_stack_ffffffffffffe368;
      uStack_1190 = uVar5;
      local_1178 = uVar6;
      palStack_1170 = in_stack_ffffffffffffe350;
      local_1158 = uVar1;
      uStack_1150 = uVar2;
      local_1138 = in_stack_ffffffffffffe3a8;
      palStack_1130 = in_stack_ffffffffffffe3b0;
      local_1118 = in_stack_ffffffffffffe3b8;
      uStack_1110 = in_stack_ffffffffffffe3c0;
      local_10f8 = uVar3;
      uStack_10f0 = uVar4;
      local_10d8 = in_stack_ffffffffffffe358;
      palStack_10d0 = in_stack_ffffffffffffe360;
      local_10b8 = uVar6;
      palStack_10b0 = in_stack_ffffffffffffe350;
      fold_4(palVar8,xmm_crc1_00,xmm_crc2_00,in_stack_ffffffffffffe3d0);
      local_420 = local_1b78;
      local_438 = local_1ba8;
      uStack_430 = uStack_1ba0;
      *local_1b78 = local_1ba8;
      local_1b78[1] = uStack_1ba0;
      local_440 = local_1b78 + 2;
      local_458 = local_1bb8;
      uStack_450 = uStack_1bb0;
      *local_440 = local_1bb8;
      local_1b78[3] = uStack_1bb0;
      local_460 = local_1b78 + 4;
      local_478 = local_1bc8;
      uStack_470 = uStack_1bc0;
      *local_460 = local_1bc8;
      local_1b78[5] = uStack_1bc0;
      local_480 = local_1b78 + 6;
      local_498 = local_1bd8;
      uStack_490 = uStack_1bd0;
      *local_480 = local_1bd8;
      local_1b78[7] = uStack_1bd0;
      local_1b78 = local_1b78 + 8;
      local_13e8 = local_1ba8;
      uStack_13e0 = uStack_1ba0;
      local_1408 = local_1ba8 ^ uVar6;
      uStack_1400 = uStack_1ba0 ^ (ulong)in_stack_ffffffffffffe350;
      local_1428 = local_1408 ^ (ulong)in_stack_ffffffffffffe368;
      uStack_1420 = uStack_1400 ^ uVar5;
      local_1448 = local_1428 ^ uVar3;
      uStack_1440 = uStack_1420 ^ uVar4;
      local_1468 = local_1448 ^ (ulong)in_stack_ffffffffffffe3b8;
      uStack_1460 = uStack_1440 ^ in_stack_ffffffffffffe3c0;
      local_1488 = local_1468 ^ (ulong)in_stack_ffffffffffffe3a8;
      uStack_1480 = uStack_1460 ^ (ulong)in_stack_ffffffffffffe3b0;
      local_1668 = local_1488 ^ (ulong)in_stack_ffffffffffffe398;
      uStack_1660 = uStack_1480 ^ (ulong)in_stack_ffffffffffffe3a0;
      local_14a8 = local_1bb8;
      uStack_14a0 = uStack_1bb0;
      local_14c8 = local_1bb8 ^ (ulong)in_stack_ffffffffffffe358;
      uStack_14c0 = uStack_1bb0 ^ (ulong)in_stack_ffffffffffffe360;
      local_14e8 = local_14c8 ^ (ulong)in_stack_ffffffffffffe368;
      uStack_14e0 = uStack_14c0 ^ uVar5;
      local_1508 = local_14e8 ^ (ulong)in_stack_ffffffffffffe3a8;
      uStack_1500 = uStack_14e0 ^ (ulong)in_stack_ffffffffffffe3b0;
      local_1528 = local_1508 ^ (ulong)in_stack_ffffffffffffe398;
      uStack_1520 = uStack_1500 ^ (ulong)in_stack_ffffffffffffe3a0;
      local_1688 = local_1528 ^ uVar1;
      uStack_1680 = uStack_1520 ^ uVar2;
      local_1548 = local_1bc8;
      uStack_1540 = uStack_1bc0;
      local_1568 = local_1bc8 ^ uVar6;
      uStack_1560 = uStack_1bc0 ^ (ulong)in_stack_ffffffffffffe350;
      local_1588 = local_1568 ^ (ulong)in_stack_ffffffffffffe358;
      uStack_1580 = uStack_1560 ^ (ulong)in_stack_ffffffffffffe360;
      local_15a8 = local_1588 ^ uVar3;
      uStack_15a0 = uStack_1580 ^ uVar4;
      local_15c8 = local_15a8 ^ (ulong)in_stack_ffffffffffffe398;
      uStack_15c0 = uStack_15a0 ^ (ulong)in_stack_ffffffffffffe3a0;
      local_16a8 = local_15c8 ^ uVar1;
      uStack_16a0 = uStack_15c0 ^ uVar2;
      local_15e8 = local_1bd8;
      uStack_15e0 = uStack_1bd0;
      local_1608 = local_1bd8 ^ uVar6;
      uStack_1600 = uStack_1bd0 ^ (ulong)in_stack_ffffffffffffe350;
      local_1628 = local_1608 ^ (ulong)in_stack_ffffffffffffe368;
      uStack_1620 = uStack_1600 ^ uVar5;
      local_1648 = local_1628 ^ uVar3;
      uStack_1640 = uStack_1620 ^ uVar4;
      local_16c8 = local_1648 ^ uVar1;
      uStack_16c0 = uStack_1640 ^ uVar2;
      local_1678 = local_1be8;
      uStack_1670 = uStack_1be0;
      local_1be8 = local_1668 ^ local_1be8;
      uStack_1be0 = uStack_1660 ^ uStack_1be0;
      local_1698 = local_1bf8;
      uStack_1690 = uStack_1bf0;
      local_1bf8 = local_1688 ^ local_1bf8;
      uStack_1bf0 = uStack_1680 ^ uStack_1bf0;
      local_16b8 = local_1c08;
      uStack_16b0 = uStack_1c00;
      local_1c08 = local_16a8 ^ local_1c08;
      uStack_1c00 = uStack_16a0 ^ uStack_1c00;
      palVar7 = (__m128i *)(local_16c8 ^ (ulong)palVar8);
      uVar9 = uStack_16c0 ^ uVar10;
      local_1ae8 = local_1b80 + 0x38;
      local_1ba8 = *local_1ae8;
      uStack_1ba0 = local_1b80[0x39];
      local_1af0 = local_1b80 + 0x3a;
      local_1bb8 = *local_1af0;
      uStack_1bb0 = local_1b80[0x3b];
      local_1af8 = local_1b80 + 0x3c;
      local_1bc8 = *local_1af8;
      uStack_1bc0 = local_1b80[0x3d];
      local_1b00 = local_1b80 + 0x3e;
      local_1bd8 = *local_1b00;
      uStack_1bd0 = local_1b80[0x3f];
      local_16d8 = palVar8;
      uStack_16d0 = uVar10;
      local_1658 = uVar1;
      uStack_1650 = uVar2;
      local_1638 = uVar3;
      uStack_1630 = uVar4;
      local_1618 = in_stack_ffffffffffffe368;
      uStack_1610 = uVar5;
      local_15f8 = uVar6;
      palStack_15f0 = in_stack_ffffffffffffe350;
      local_15d8 = uVar1;
      uStack_15d0 = uVar2;
      local_15b8 = in_stack_ffffffffffffe398;
      palStack_15b0 = in_stack_ffffffffffffe3a0;
      local_1598 = uVar3;
      uStack_1590 = uVar4;
      local_1578 = in_stack_ffffffffffffe358;
      palStack_1570 = in_stack_ffffffffffffe360;
      local_1558 = uVar6;
      palStack_1550 = in_stack_ffffffffffffe350;
      local_1538 = uVar1;
      uStack_1530 = uVar2;
      local_1518 = in_stack_ffffffffffffe398;
      palStack_1510 = in_stack_ffffffffffffe3a0;
      local_14f8 = in_stack_ffffffffffffe3a8;
      palStack_14f0 = in_stack_ffffffffffffe3b0;
      local_14d8 = in_stack_ffffffffffffe368;
      uStack_14d0 = uVar5;
      local_14b8 = in_stack_ffffffffffffe358;
      palStack_14b0 = in_stack_ffffffffffffe360;
      local_1498 = in_stack_ffffffffffffe398;
      palStack_1490 = in_stack_ffffffffffffe3a0;
      local_1478 = in_stack_ffffffffffffe3a8;
      palStack_1470 = in_stack_ffffffffffffe3b0;
      local_1458 = in_stack_ffffffffffffe3b8;
      uStack_1450 = in_stack_ffffffffffffe3c0;
      local_1438 = uVar3;
      uStack_1430 = uVar4;
      local_1418 = in_stack_ffffffffffffe368;
      uStack_1410 = uVar5;
      local_13f8 = uVar6;
      palStack_13f0 = in_stack_ffffffffffffe350;
      fold_4(palVar7,xmm_crc1_00,xmm_crc2_00,in_stack_ffffffffffffe3d0);
      local_4a0 = local_1b78;
      local_4b8 = local_1ba8;
      uStack_4b0 = uStack_1ba0;
      *local_1b78 = local_1ba8;
      local_1b78[1] = uStack_1ba0;
      local_4c0 = local_1b78 + 2;
      local_4d8 = local_1bb8;
      uStack_4d0 = uStack_1bb0;
      *local_4c0 = local_1bb8;
      local_1b78[3] = uStack_1bb0;
      local_4e0 = local_1b78 + 4;
      local_4f8 = local_1bc8;
      uStack_4f0 = uStack_1bc0;
      *local_4e0 = local_1bc8;
      local_1b78[5] = uStack_1bc0;
      local_500 = local_1b78 + 6;
      local_518 = local_1bd8;
      uStack_510 = uStack_1bd0;
      *local_500 = local_1bd8;
      local_1b78[7] = uStack_1bd0;
      local_1b78 = local_1b78 + 8;
      local_16e8 = local_1ba8;
      uStack_16e0 = uStack_1ba0;
      local_1708 = local_1ba8 ^ (ulong)in_stack_ffffffffffffe358;
      uStack_1700 = uStack_1ba0 ^ (ulong)in_stack_ffffffffffffe360;
      local_1728 = local_1708 ^ (ulong)in_stack_ffffffffffffe368;
      uStack_1720 = uStack_1700 ^ uVar5;
      local_1ba8 = local_1728 ^ uVar3;
      uStack_1ba0 = uStack_1720 ^ uVar4;
      local_1748 = local_1bb8;
      uStack_1740 = uStack_1bb0;
      local_1768 = local_1bb8 ^ uVar6;
      uStack_1760 = uStack_1bb0 ^ (ulong)in_stack_ffffffffffffe350;
      local_1788 = local_1768 ^ (ulong)in_stack_ffffffffffffe358;
      uStack_1780 = uStack_1760 ^ (ulong)in_stack_ffffffffffffe360;
      local_1bb8 = local_1788 ^ (ulong)in_stack_ffffffffffffe368;
      uStack_1bb0 = uStack_1780 ^ uVar5;
      local_17a8 = local_1bc8;
      uStack_17a0 = uStack_1bc0;
      local_17c8 = local_1bc8 ^ uVar6;
      uStack_17c0 = uStack_1bc0 ^ (ulong)in_stack_ffffffffffffe350;
      local_1bc8 = local_17c8 ^ (ulong)in_stack_ffffffffffffe358;
      uStack_1bc0 = uStack_17c0 ^ (ulong)in_stack_ffffffffffffe360;
      local_17e8 = local_1bd8;
      uStack_17e0 = uStack_1bd0;
      local_1bd8 = local_1bd8 ^ uVar6;
      uStack_1bd0 = uStack_1bd0 ^ (ulong)in_stack_ffffffffffffe350;
      local_1818 = local_1be8;
      uStack_1810 = uStack_1be0;
      local_1be8 = local_1ba8 ^ local_1be8;
      uStack_1be0 = uStack_1ba0 ^ uStack_1be0;
      local_1838 = local_1bf8;
      uStack_1830 = uStack_1bf0;
      local_1bf8 = local_1bb8 ^ local_1bf8;
      uStack_1bf0 = uStack_1bb0 ^ uStack_1bf0;
      local_1858 = local_1c08;
      uStack_1850 = uStack_1c00;
      local_1c08 = local_1bc8 ^ local_1c08;
      uStack_1c00 = uStack_1bc0 ^ uStack_1c00;
      in_stack_ffffffffffffe3e8 = (__m128i *)(local_1bd8 ^ (ulong)palVar7);
      uStack_1c10 = uStack_1bd0 ^ uVar9;
      local_1b80 = local_1b80 + 0x40;
      local_1878 = palVar7;
      uStack_1870 = uVar9;
      local_1868 = local_1bd8;
      uStack_1860 = uStack_1bd0;
      local_1848 = local_1bc8;
      uStack_1840 = uStack_1bc0;
      local_1828 = local_1bb8;
      uStack_1820 = uStack_1bb0;
      local_1808 = local_1ba8;
      uStack_1800 = uStack_1ba0;
      local_17f8 = uVar6;
      palStack_17f0 = in_stack_ffffffffffffe350;
      local_17d8 = in_stack_ffffffffffffe358;
      palStack_17d0 = in_stack_ffffffffffffe360;
      local_17b8 = uVar6;
      palStack_17b0 = in_stack_ffffffffffffe350;
      local_1798 = in_stack_ffffffffffffe368;
      uStack_1790 = uVar5;
      local_1778 = in_stack_ffffffffffffe358;
      palStack_1770 = in_stack_ffffffffffffe360;
      local_1758 = uVar6;
      palStack_1750 = in_stack_ffffffffffffe350;
      local_1738 = uVar3;
      uStack_1730 = uVar4;
      local_1718 = in_stack_ffffffffffffe368;
      uStack_1710 = uVar5;
      local_16f8 = in_stack_ffffffffffffe358;
      palStack_16f0 = in_stack_ffffffffffffe360;
    }
    while (palVar7 = in_stack_ffffffffffffe3e8, 0x3f < local_1b88) {
      local_1b88 = local_1b88 - 0x40;
      local_1b10 = local_1b80;
      local_1ba8 = *local_1b80;
      uStack_1ba0 = local_1b80[1];
      local_1b18 = local_1b80 + 2;
      local_1bb8 = *local_1b18;
      uStack_1bb0 = local_1b80[3];
      local_1b20 = local_1b80 + 4;
      local_1bc8 = *local_1b20;
      uStack_1bc0 = local_1b80[5];
      local_1b28 = local_1b80 + 6;
      local_1bd8 = *local_1b28;
      uStack_1bd0 = local_1b80[7];
      local_1b80 = local_1b80 + 8;
      fold_4(palVar7,xmm_crc1_00,xmm_crc2_00,in_stack_ffffffffffffe3d0);
      local_520 = local_1b78;
      local_538 = local_1ba8;
      uStack_530 = uStack_1ba0;
      *local_1b78 = local_1ba8;
      local_1b78[1] = uStack_1ba0;
      local_540 = local_1b78 + 2;
      local_558 = local_1bb8;
      uStack_550 = uStack_1bb0;
      *local_540 = local_1bb8;
      local_1b78[3] = uStack_1bb0;
      local_560 = local_1b78 + 4;
      local_578 = local_1bc8;
      uStack_570 = uStack_1bc0;
      *local_560 = local_1bc8;
      local_1b78[5] = uStack_1bc0;
      local_580 = local_1b78 + 6;
      local_598 = local_1bd8;
      uStack_590 = uStack_1bd0;
      *local_580 = local_1bd8;
      local_1b78[7] = uStack_1bd0;
      local_1b78 = local_1b78 + 8;
      local_1888 = local_1be8;
      uStack_1880 = uStack_1be0;
      local_1898 = local_1ba8;
      uStack_1890 = uStack_1ba0;
      local_1be8 = local_1be8 ^ local_1ba8;
      uStack_1be0 = uStack_1be0 ^ uStack_1ba0;
      local_18a8 = local_1bf8;
      uStack_18a0 = uStack_1bf0;
      local_18b8 = local_1bb8;
      uStack_18b0 = uStack_1bb0;
      local_1bf8 = local_1bf8 ^ local_1bb8;
      uStack_1bf0 = uStack_1bf0 ^ uStack_1bb0;
      local_18c8 = local_1c08;
      uStack_18c0 = uStack_1c00;
      local_18d8 = local_1bc8;
      uStack_18d0 = uStack_1bc0;
      local_1c08 = local_1c08 ^ local_1bc8;
      uStack_1c00 = uStack_1c00 ^ uStack_1bc0;
      uStack_18e0 = uStack_1c10;
      local_18f8 = local_1bd8;
      uStack_18f0 = uStack_1bd0;
      uStack_1c10 = uStack_1c10 ^ uStack_1bd0;
      in_stack_ffffffffffffe3e8 = (__m128i *)((ulong)palVar7 ^ local_1bd8);
      local_18e8 = palVar7;
    }
    if (local_1b88 < 0x30) {
      if (local_1b88 < 0x20) {
        if (0xf < local_1b88) {
          local_1b88 = local_1b88 - 0x10;
          local_1b58 = local_1b80;
          local_1ba8 = *local_1b80;
          uStack_1ba0 = local_1b80[1];
          local_1b80 = local_1b80 + 2;
          local_640 = local_1b78;
          *local_1b78 = local_1ba8;
          local_1b78[1] = uStack_1ba0;
          local_1b78 = local_1b78 + 2;
          local_658 = local_1ba8;
          uStack_650 = uStack_1ba0;
          fold_1((__m128i *)&local_1be8,(__m128i *)&local_1bf8,(__m128i *)&local_1c08,
                 (__m128i *)&stack0xffffffffffffe3e8);
          uStack_19a0 = uStack_1c10;
          local_19b8 = local_1ba8;
          uStack_19b0 = uStack_1ba0;
          local_19a8 = palVar7;
        }
      }
      else {
        local_1b88 = local_1b88 - 0x20;
        local_1b48 = local_1b80;
        local_1ba8 = *local_1b80;
        uStack_1ba0 = local_1b80[1];
        local_1b50 = local_1b80 + 2;
        local_1bb8 = *local_1b50;
        uStack_1bb0 = local_1b80[3];
        local_1b80 = local_1b80 + 4;
        local_600 = local_1b78;
        *local_1b78 = local_1ba8;
        local_1b78[1] = uStack_1ba0;
        local_620 = local_1b78 + 2;
        *local_620 = local_1bb8;
        local_1b78[3] = uStack_1bb0;
        local_1b78 = local_1b78 + 4;
        local_638 = local_1bb8;
        uStack_630 = uStack_1bb0;
        local_618 = local_1ba8;
        uStack_610 = uStack_1ba0;
        fold_2(in_stack_ffffffffffffe368,in_stack_ffffffffffffe360,in_stack_ffffffffffffe358,
               in_stack_ffffffffffffe350);
        local_1968 = local_1c08;
        uStack_1960 = uStack_1c00;
        local_1978 = local_1ba8;
        uStack_1970 = uStack_1ba0;
        local_1c08 = local_1c08 ^ local_1ba8;
        uStack_1c00 = uStack_1c00 ^ uStack_1ba0;
        uStack_1980 = uStack_1c10;
        local_1998 = local_1bb8;
        uStack_1990 = uStack_1bb0;
        local_1988 = palVar7;
      }
    }
    else {
      local_1b88 = local_1b88 - 0x30;
      local_1b30 = local_1b80;
      local_1ba8 = *local_1b80;
      uStack_1ba0 = local_1b80[1];
      local_1b38 = local_1b80 + 2;
      local_1bb8 = *local_1b38;
      uStack_1bb0 = local_1b80[3];
      local_1b40 = local_1b80 + 4;
      local_1bc8 = *local_1b40;
      uStack_1bc0 = local_1b80[5];
      local_1b80 = local_1b80 + 6;
      local_5a0 = local_1b78;
      *local_1b78 = local_1ba8;
      local_1b78[1] = uStack_1ba0;
      local_5c0 = local_1b78 + 2;
      *local_5c0 = local_1bb8;
      local_1b78[3] = uStack_1bb0;
      local_5e0 = local_1b78 + 4;
      *local_5e0 = local_1bc8;
      local_1b78[5] = uStack_1bc0;
      local_1b78 = local_1b78 + 6;
      local_5f8 = local_1bc8;
      uStack_5f0 = uStack_1bc0;
      local_5d8 = local_1bb8;
      uStack_5d0 = uStack_1bb0;
      local_5b8 = local_1ba8;
      uStack_5b0 = uStack_1ba0;
      fold_3(in_stack_ffffffffffffe368,in_stack_ffffffffffffe360,in_stack_ffffffffffffe358,
             in_stack_ffffffffffffe350);
      local_1908 = local_1bf8;
      uStack_1900 = uStack_1bf0;
      local_1918 = local_1ba8;
      uStack_1910 = uStack_1ba0;
      local_1bf8 = local_1bf8 ^ local_1ba8;
      uStack_1bf0 = uStack_1bf0 ^ uStack_1ba0;
      local_1928 = local_1c08;
      uStack_1920 = uStack_1c00;
      local_1938 = local_1bb8;
      uStack_1930 = uStack_1bb0;
      local_1c08 = local_1c08 ^ local_1bb8;
      uStack_1c00 = uStack_1c00 ^ uStack_1bb0;
      uStack_1940 = uStack_1c10;
      local_1958 = local_1bc8;
      uStack_1950 = uStack_1bc0;
      local_1948 = palVar7;
    }
  }
  if (local_1b88 != 0) {
    memcpy(&stack0xffffffffffffe3d8,local_1b80,local_1b88);
    local_660 = &local_1c38;
    local_678 = xmm_crc2_00;
    palStack_670 = xmm_crc1_00;
    local_1c38 = xmm_crc2_00;
    memcpy(local_1b78,&local_1c38,local_1b88);
    partial_fold(in_stack_ffffffffffffe3c0,in_stack_ffffffffffffe3b8,in_stack_ffffffffffffe3b0,
                 in_stack_ffffffffffffe3a8,in_stack_ffffffffffffe3a0,in_stack_ffffffffffffe398);
  }
  crc32_fold_save(local_1b70,(__m128i *)&local_1be8,(__m128i *)&local_1bf8,(__m128i *)&local_1c08,
                  (__m128i *)&stack0xffffffffffffe3e8);
  return;
}

Assistant:

Z_INTERNAL void CRC32_FOLD(crc32_fold *crc, const uint8_t *src, size_t len, uint32_t init_crc) {
#endif
    unsigned long algn_diff;
    __m128i xmm_t0, xmm_t1, xmm_t2, xmm_t3;
    __m128i xmm_crc0, xmm_crc1, xmm_crc2, xmm_crc3;
    __m128i xmm_crc_part = _mm_setzero_si128();
    char ALIGNED_(16) partial_buf[16] = { 0 };
#ifndef COPY
    __m128i xmm_initial = _mm_cvtsi32_si128(init_crc);
    int32_t first = init_crc != 0;

    /* The CRC functions don't call this for input < 16, as a minimum of 16 bytes of input is needed
     * for the aligning load that occurs.  If there's an initial CRC, to carry it forward through
     * the folded CRC there must be 16 - src % 16 + 16 bytes available, which by definition can be
     * up to 15 bytes + one full vector load. */
    assert(len >= 16 || first == 0);
#endif
    crc32_fold_load((__m128i *)crc->fold, &xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);

    if (len < 16) {
        if (len == 0)
            return;

        memcpy(partial_buf, src, len);
        xmm_crc_part = _mm_load_si128((const __m128i *)partial_buf);
#ifdef COPY
        memcpy(dst, partial_buf, len);
#endif
        goto partial;
    }

    algn_diff = ((uintptr_t)16 - ((uintptr_t)src & 0xF)) & 0xF;
    if (algn_diff) {
        xmm_crc_part = _mm_loadu_si128((__m128i *)src);
#ifdef COPY
        _mm_storeu_si128((__m128i *)dst, xmm_crc_part);
        dst += algn_diff;
#else
        XOR_INITIAL128(xmm_crc_part);

        if (algn_diff < 4 && init_crc != 0) {
            xmm_t0 = xmm_crc_part;
            if (len >= 32) {
                xmm_crc_part = _mm_loadu_si128((__m128i*)src + 1);
                fold_1(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
                xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t0);
            } else {
                memcpy(partial_buf, src + 16, len - 16);
                xmm_crc_part = _mm_load_si128((__m128i*)partial_buf);
                fold_1(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
                xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t0);
                src += 16;
                len -= 16;
#ifdef COPY
                dst -= algn_diff;
#endif
                goto partial;
            }

            src += 16;
            len -= 16;
        }
#endif

        partial_fold(algn_diff, &xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3, &xmm_crc_part);

        src += algn_diff;
        len -= algn_diff;
    }

#ifdef X86_VPCLMULQDQ
    if (len >= 256) {
#ifdef COPY
        size_t n = fold_16_vpclmulqdq_copy(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3, dst, src, len);
        dst += n;
#else
        size_t n = fold_16_vpclmulqdq(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3, src, len,
            xmm_initial, first);
        first = 0;
#endif
        len -= n;
        src += n;
    }
#endif

#ifndef WITHOUT_CHORBA
        /* Implement Chorba algorithm from https://arxiv.org/abs/2412.16398
         * We interleave the PCLMUL-base folds with 8x scaled generator
         * polynomial copies; we read 8x QWORDS and then XOR them into
         * the stream at the following offsets: 6, 9, 10, 16, 20, 22,
         * 24, 25, 27, 28, 30, 31, 32 - this is detailed in the paper
         * as "generator_64_bits_unrolled_8" */
        while (len >= 512 + 64 + 16*8) {
            __m128i chorba8 = _mm_loadu_si128((__m128i *)src);
            __m128i chorba7 = _mm_loadu_si128((__m128i *)src + 1);
            __m128i chorba6 = _mm_loadu_si128((__m128i *)src + 2);
            __m128i chorba5 = _mm_loadu_si128((__m128i *)src + 3);
            __m128i chorba4 = _mm_loadu_si128((__m128i *)src + 4);
            __m128i chorba3 = _mm_loadu_si128((__m128i *)src + 5);
            __m128i chorba2 = _mm_loadu_si128((__m128i *)src + 6);
            __m128i chorba1 = _mm_loadu_si128((__m128i *)src + 7);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, chorba8);
            _mm_storeu_si128((__m128i *)dst + 1, chorba7);
            _mm_storeu_si128((__m128i *)dst + 2, chorba6);
            _mm_storeu_si128((__m128i *)dst + 3, chorba5);
            _mm_storeu_si128((__m128i *)dst + 4, chorba4);
            _mm_storeu_si128((__m128i *)dst + 5, chorba3);
            _mm_storeu_si128((__m128i *)dst + 6, chorba2);
            _mm_storeu_si128((__m128i *)dst + 7, chorba1);
            dst += 16*8;
#else
            XOR_INITIAL128(chorba8);
#endif
            chorba2 = _mm_xor_si128(chorba2, chorba8);
            chorba1 = _mm_xor_si128(chorba1, chorba7);
            src += 16*8;
            len -= 16*8;

            xmm_t0 = _mm_loadu_si128((__m128i *)src);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 1);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 2);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 3);

            fold_12(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif
            xmm_t0 = _mm_xor_si128(xmm_t0, chorba6);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(xmm_t1, chorba5), chorba8);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t2, chorba4), chorba8), chorba7);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t3, chorba3), chorba7), chorba6);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 4);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 5);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 6);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 7);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif

            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba2), chorba6), chorba5);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba1), chorba4), chorba5);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(xmm_t2, chorba3), chorba4);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(xmm_t3, chorba2), chorba3);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 8);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 9);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 10);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 11);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif

            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba1), chorba2), chorba8);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(xmm_t1, chorba1), chorba7);
            xmm_t2 = _mm_xor_si128(xmm_t2, chorba6);
            xmm_t3 = _mm_xor_si128(xmm_t3, chorba5);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 12);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 13);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 14);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 15);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif

            xmm_t0 = _mm_xor_si128(_mm_xor_si128(xmm_t0, chorba4), chorba8);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba3), chorba8), chorba7);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t2, chorba2), chorba8), chorba7), chorba6);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t3, chorba1), chorba7), chorba6), chorba5);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 16);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 17);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 18);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 19);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif

            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba4), chorba8), chorba6), chorba5);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba3), chorba4), chorba8), chorba7), chorba5);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t2, chorba2), chorba3), chorba4), chorba7), chorba6);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t3, chorba1), chorba2), chorba3), chorba8), chorba6), chorba5);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 20);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 21);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 22);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 23);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif

            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba1), chorba2), chorba4), chorba8), chorba7), chorba5);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba1), chorba3), chorba4), chorba7), chorba6);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t2, chorba2), chorba3), chorba8), chorba6), chorba5);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t3, chorba1), chorba2), chorba4), chorba8), chorba7), chorba5);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 24);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 25);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 26);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 27);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif
            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba1), chorba3), chorba4), chorba8), chorba7), chorba6);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba2), chorba3), chorba7), chorba6), chorba5);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t2, chorba1), chorba2), chorba4), chorba6), chorba5);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t3, chorba1), chorba3), chorba4), chorba5);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 28);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 29);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 30);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 31);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif
            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba2), chorba3), chorba4);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba1), chorba2), chorba3);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(xmm_t2, chorba1), chorba2);
            xmm_t3 = _mm_xor_si128(xmm_t3, chorba1);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            len -= 512;
            src += 512;
        }
#endif /* WITHOUT_CHORBA */

    while (len >= 64) {
        len -= 64;
        xmm_t0 = _mm_load_si128((__m128i *)src);
        xmm_t1 = _mm_load_si128((__m128i *)src + 1);
        xmm_t2 = _mm_load_si128((__m128i *)src + 2);
        xmm_t3 = _mm_load_si128((__m128i *)src + 3);
        src += 64;

        fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
        _mm_storeu_si128((__m128i *)dst, xmm_t0);
        _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
        _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
        _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
        dst += 64;
#else
        XOR_INITIAL128(xmm_t0);
#endif

        xmm_crc0 = _mm_xor_si128(xmm_crc0, xmm_t0);
        xmm_crc1 = _mm_xor_si128(xmm_crc1, xmm_t1);
        xmm_crc2 = _mm_xor_si128(xmm_crc2, xmm_t2);
        xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t3);
    }

    /*
     * len = num bytes left - 64
     */
    if (len >= 48) {
        len -= 48;

        xmm_t0 = _mm_load_si128((__m128i *)src);
        xmm_t1 = _mm_load_si128((__m128i *)src + 1);
        xmm_t2 = _mm_load_si128((__m128i *)src + 2);
        src += 48;
#ifdef COPY
        _mm_storeu_si128((__m128i *)dst, xmm_t0);
        _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
        _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
        dst += 48;
#else
        XOR_INITIAL128(xmm_t0);
#endif
        fold_3(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);

        xmm_crc1 = _mm_xor_si128(xmm_crc1, xmm_t0);
        xmm_crc2 = _mm_xor_si128(xmm_crc2, xmm_t1);
        xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t2);
    } else if (len >= 32) {
        len -= 32;

        xmm_t0 = _mm_load_si128((__m128i *)src);
        xmm_t1 = _mm_load_si128((__m128i *)src + 1);
        src += 32;
#ifdef COPY
        _mm_storeu_si128((__m128i *)dst, xmm_t0);
        _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
        dst += 32;
#else
        XOR_INITIAL128(xmm_t0);
#endif
        fold_2(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);

        xmm_crc2 = _mm_xor_si128(xmm_crc2, xmm_t0);
        xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t1);
    } else if (len >= 16) {
        len -= 16;
        xmm_t0 = _mm_load_si128((__m128i *)src);
        src += 16;
#ifdef COPY
        _mm_storeu_si128((__m128i *)dst, xmm_t0);
        dst += 16;
#else
        XOR_INITIAL128(xmm_t0);
#endif
        fold_1(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);

        xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t0);
    }

partial:
    if (len) {
        memcpy(&xmm_crc_part, src, len);
#ifdef COPY
        _mm_storeu_si128((__m128i *)partial_buf, xmm_crc_part);
        memcpy(dst, partial_buf, len);
#endif
        partial_fold(len, &xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3, &xmm_crc_part);
    }

    crc32_fold_save((__m128i *)crc->fold, &xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
}